

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

void __thiscall ctemplate::Template::StripBuffer(Template *this,char **buffer,size_t *len)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  void *pvVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *buffer_00;
  char *line;
  MarkerDelimiters delim;
  
  if (this->strip_ != DO_NOT_STRIP) {
    pcVar8 = *buffer;
    pcVar1 = pcVar8 + *len;
    pcVar3 = (char *)operator_new__(*len);
    delim.start_marker = "{{";
    delim.start_marker_len = 2;
    delim.end_marker = "}}";
    delim.end_marker_len = 2;
    buffer_00 = pcVar3;
LAB_001232a8:
    line = pcVar8;
    if (line < pcVar1) {
      pvVar4 = memchr(line,10,(long)pcVar1 - (long)line);
      pcVar8 = (char *)((long)pvVar4 + 1);
      if (pvVar4 == (void *)0x0) {
        pcVar8 = pcVar1;
      }
      sVar5 = InsertLine(line,(long)pcVar8 - (long)line,this->strip_,&delim,buffer_00);
      buffer_00 = buffer_00 + sVar5;
      if ((buffer_00 < pcVar3) || (*len < (ulong)((long)buffer_00 - (long)pcVar3))) {
        __assert_fail("write_pos >= retval && static_cast<size_t>(write_pos-retval) <= *len",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                      ,0x9f4,"void ctemplate::Template::StripBuffer(char **, size_t *)");
      }
      while ((sVar5 = delim.start_marker_len, line != (char *)0x0 &&
             (pcVar6 = anon_unknown_14::memmatch
                                 (line,(long)pcVar8 - (long)line,delim.start_marker,
                                  delim.start_marker_len), sVar2 = delim.end_marker_len,
             pcVar6 != (char *)0x0))) {
        pcVar6 = pcVar6 + sVar5;
        pcVar7 = anon_unknown_14::memmatch
                           (pcVar6,(long)pcVar8 - (long)pcVar6,delim.end_marker,delim.end_marker_len
                           );
        if (pcVar7 == (char *)0x0) break;
        if ((long)pcVar7 - (long)pcVar6 < 0) {
          __assert_fail("((end_marker - delim.end_marker_len) - (marker + delim.start_marker_len)) >= 0"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                        ,0xa0a,"void ctemplate::Template::StripBuffer(char **, size_t *)");
        }
        line = pcVar7 + sVar2;
        ParseDelimiters(pcVar6,(long)pcVar7 - (long)pcVar6,&delim);
      }
      goto LAB_001232a8;
    }
    if (buffer_00 < pcVar3) {
      __assert_fail("write_pos >= retval",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                    ,0xa11,"void ctemplate::Template::StripBuffer(char **, size_t *)");
    }
    if (*buffer != (char *)0x0) {
      operator_delete__(*buffer);
    }
    *buffer = pcVar3;
    *len = (long)buffer_00 - (long)pcVar3;
  }
  return;
}

Assistant:

void Template::StripBuffer(char **buffer, size_t* len) {
  if (strip_ == DO_NOT_STRIP)
    return;

  char* bufend = *buffer + *len;
  char* retval = new char[*len];
  char* write_pos = retval;

  MarkerDelimiters delim;

  const char* next_pos = NULL;
  for (const char* prev_pos = *buffer; prev_pos < bufend; prev_pos = next_pos) {
    next_pos = (char*)memchr(prev_pos, '\n', bufend - prev_pos);
    if (next_pos)
      next_pos++;          // include the newline
    else
      next_pos = bufend;   // for the last line, when it has no newline

    write_pos += InsertLine(prev_pos, next_pos - prev_pos, strip_, delim,
                            write_pos);
    assert(write_pos >= retval &&
           static_cast<size_t>(write_pos-retval) <= *len);

    // Before looking at the next line, see if the current line
    // changed the marker-delimiter.  We care for
    // IsBlankOrOnlyHasOneRemovableMarker, so we don't need to be
    // perfect -- we don't have to handle the delimiter changing in
    // the middle of a line -- just make sure that the next time
    // there's only one marker on a line, we notice because we know
    // the right delim.
    const char* end_marker = NULL;
    for (const char* marker = prev_pos; marker; marker = end_marker) {
      marker = memmatch(marker, next_pos - marker,
                        delim.start_marker, delim.start_marker_len);
      if (!marker)  break;
      end_marker = memmatch(marker + delim.start_marker_len,
                            next_pos - (marker + delim.start_marker_len),
                            delim.end_marker, delim.end_marker_len);
      if (!end_marker)  break;
      end_marker += delim.end_marker_len;  // needed for the for loop
      // This tries to parse the marker as a set-delimiters marker.
      // If it succeeds, it updates delim. If not, it ignores it.
      assert(((end_marker - delim.end_marker_len)
              - (marker + delim.start_marker_len)) >= 0);
      Template::ParseDelimiters(marker + delim.start_marker_len,
                                ((end_marker - delim.end_marker_len)
                                 - (marker + delim.start_marker_len)),
                                &delim);
    }
  }
  assert(write_pos >= retval);

  // Replace the input retval with our new retval.
  delete[] *buffer;
  *buffer = retval;
  *len = static_cast<size_t>(write_pos - retval);
}